

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode_api_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_a078f1::EncodeAPI_InvalidControlId_Test::TestBody
          (EncodeAPI_InvalidControlId_Test *this)

{
  bool bVar1;
  AssertHelper *this_00;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  aom_codec_enc_cfg_t cfg;
  aom_codec_ctx_t enc;
  aom_codec_iface_t *iface;
  aom_codec_ctx_t *in_stack_fffffffffffffb28;
  AssertHelper *in_stack_fffffffffffffb30;
  aom_codec_enc_cfg_t *in_stack_fffffffffffffb38;
  aom_codec_iface_t *in_stack_fffffffffffffb40;
  char *in_stack_fffffffffffffb48;
  int line;
  aom_codec_enc_cfg_t *in_stack_fffffffffffffb50;
  undefined4 in_stack_fffffffffffffb58;
  Type in_stack_fffffffffffffb5c;
  aom_codec_ctx_t *in_stack_fffffffffffffb60;
  AssertionResult local_490 [2];
  aom_codec_err_t local_470;
  undefined4 local_46c;
  AssertionResult local_468;
  Message *in_stack_fffffffffffffba8;
  AssertHelper *in_stack_fffffffffffffbb0;
  AssertionResult local_440 [2];
  aom_codec_err_t local_420;
  undefined4 local_41c;
  AssertionResult local_3e0 [57];
  aom_codec_ctx_t local_48;
  aom_codec_iface_t *local_10;
  
  local_10 = aom_codec_av1_cx();
  aom_codec_enc_config_default
            (in_stack_fffffffffffffb40,in_stack_fffffffffffffb38,
             (uint)((ulong)in_stack_fffffffffffffb30 >> 0x20));
  testing::internal::EqHelper::Compare<aom_codec_err_t,_aom_codec_err_t,_nullptr>
            (in_stack_fffffffffffffb48,(char *)in_stack_fffffffffffffb40,
             &in_stack_fffffffffffffb38->g_usage,(aom_codec_err_t *)in_stack_fffffffffffffb30);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_3e0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffb60);
    in_stack_fffffffffffffb50 =
         (aom_codec_enc_cfg_t *)
         testing::AssertionResult::failure_message((AssertionResult *)0x7f1e94);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffffb60,in_stack_fffffffffffffb5c,
               (char *)in_stack_fffffffffffffb50,(int)((ulong)in_stack_fffffffffffffb48 >> 0x20),
               (char *)in_stack_fffffffffffffb40);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8);
    testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffb30);
    testing::Message::~Message((Message *)0x7f1ef1);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x7f1f62);
  local_41c = 0;
  local_420 = aom_codec_enc_init_ver
                        (in_stack_fffffffffffffb60,
                         (aom_codec_iface_t *)
                         CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58),
                         in_stack_fffffffffffffb50,(aom_codec_flags_t)in_stack_fffffffffffffb48,
                         (int)((ulong)in_stack_fffffffffffffb40 >> 0x20));
  testing::internal::EqHelper::Compare<aom_codec_err_t,_aom_codec_err_t,_nullptr>
            (in_stack_fffffffffffffb48,(char *)in_stack_fffffffffffffb40,
             &in_stack_fffffffffffffb38->g_usage,(aom_codec_err_t *)in_stack_fffffffffffffb30);
  bVar1 = testing::AssertionResult::operator_cast_to_bool
                    ((AssertionResult *)&stack0xfffffffffffffbe8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffb60);
    in_stack_fffffffffffffb48 =
         testing::AssertionResult::failure_message((AssertionResult *)0x7f200c);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffffb60,in_stack_fffffffffffffb5c,
               (char *)in_stack_fffffffffffffb50,(int)((ulong)in_stack_fffffffffffffb48 >> 0x20),
               (char *)in_stack_fffffffffffffb40);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8);
    testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffb30);
    testing::Message::~Message((Message *)0x7f2069);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x7f20d7);
  aom_codec_control(&local_48,-1,0);
  testing::internal::EqHelper::Compare<aom_codec_err_t,_aom_codec_err_t,_nullptr>
            (in_stack_fffffffffffffb48,(char *)in_stack_fffffffffffffb40,
             &in_stack_fffffffffffffb38->g_usage,(aom_codec_err_t *)in_stack_fffffffffffffb30);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_440);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffb60);
    in_stack_fffffffffffffb40 =
         (aom_codec_iface_t *)testing::AssertionResult::failure_message((AssertionResult *)0x7f2170)
    ;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffffb60,in_stack_fffffffffffffb5c,
               (char *)in_stack_fffffffffffffb50,(int)((ulong)in_stack_fffffffffffffb48 >> 0x20),
               (char *)in_stack_fffffffffffffb40);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8);
    testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffb30);
    testing::Message::~Message((Message *)0x7f21cd);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x7f223b);
  local_46c = 8;
  local_470 = aom_codec_control(&local_48,0);
  testing::internal::EqHelper::Compare<aom_codec_err_t,_aom_codec_err_t,_nullptr>
            (in_stack_fffffffffffffb48,(char *)in_stack_fffffffffffffb40,
             &in_stack_fffffffffffffb38->g_usage,(aom_codec_err_t *)in_stack_fffffffffffffb30);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_468);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffb60);
    in_stack_fffffffffffffb38 =
         (aom_codec_enc_cfg_t *)
         testing::AssertionResult::failure_message((AssertionResult *)0x7f22b9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffffb60,in_stack_fffffffffffffb5c,
               (char *)in_stack_fffffffffffffb50,(int)((ulong)in_stack_fffffffffffffb48 >> 0x20),
               (char *)in_stack_fffffffffffffb40);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8);
    testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffb30);
    testing::Message::~Message((Message *)0x7f2307);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x7f236c);
  aom_codec_destroy(in_stack_fffffffffffffb28);
  testing::internal::EqHelper::Compare<aom_codec_err_t,_aom_codec_err_t,_nullptr>
            (in_stack_fffffffffffffb48,(char *)in_stack_fffffffffffffb40,
             &in_stack_fffffffffffffb38->g_usage,(aom_codec_err_t *)in_stack_fffffffffffffb30);
  line = (int)((ulong)in_stack_fffffffffffffb48 >> 0x20);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_490);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffb60);
    this_00 = (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0x7f23e1)
    ;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffffb60,in_stack_fffffffffffffb5c,
               (char *)in_stack_fffffffffffffb50,line,(char *)in_stack_fffffffffffffb40);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8);
    testing::internal::AssertHelper::~AssertHelper(this_00);
    testing::Message::~Message((Message *)0x7f242f);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x7f2491);
  return;
}

Assistant:

TEST(EncodeAPI, InvalidControlId) {
  aom_codec_iface_t *iface = aom_codec_av1_cx();
  aom_codec_ctx_t enc;
  aom_codec_enc_cfg_t cfg;
  EXPECT_EQ(AOM_CODEC_OK, aom_codec_enc_config_default(iface, &cfg, kUsage));
  EXPECT_EQ(AOM_CODEC_OK, aom_codec_enc_init(&enc, iface, &cfg, 0));
  EXPECT_EQ(AOM_CODEC_ERROR, aom_codec_control(&enc, -1, 0));
  EXPECT_EQ(AOM_CODEC_INVALID_PARAM, aom_codec_control(&enc, 0, 0));
  EXPECT_EQ(AOM_CODEC_OK, aom_codec_destroy(&enc));
}